

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O3

int Gia_QbfSolve(Gia_Man_t *pGia,int nPars,int nIterLimit,int nConfLimit,int nTimeOut,int nEncVars,
                int fGlucose,int fVerbose)

{
  Vec_Int_t *vValues;
  bmcg_sat_solver *s;
  long lVar1;
  int iVar2;
  int iVar3;
  Qbf_Man_t *p;
  int *piVar4;
  Gia_Man_t *pCof;
  long lVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  timespec local_88;
  uint local_78;
  uint local_74;
  Qbf_Man_t *local_70;
  ulong local_68;
  int local_5c;
  uint local_58;
  int local_54;
  long local_50;
  long local_48;
  ulong local_40;
  Gia_Man_t *local_38;
  
  local_78 = nTimeOut;
  local_74 = nConfLimit;
  p = Gia_QbfAlloc(pGia,nPars,fGlucose,fVerbose);
  if (fVerbose != 0) {
    printf("Solving QBF for \"%s\" with %d parameters, %d variables and %d AIG nodes.\n",pGia->pName
           ,(ulong)(uint)p->nPars,(ulong)(uint)p->nVars);
  }
  local_38 = pGia;
  if (pGia->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pGia) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                  ,0x34a,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
  }
  vValues = p->vValues;
  if (vValues->nCap < nPars) {
    if (vValues->pArray == (int *)0x0) {
      piVar4 = (int *)malloc((long)nPars << 2);
    }
    else {
      piVar4 = (int *)realloc(vValues->pArray,(long)nPars << 2);
    }
    vValues->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vValues->nCap = nPars;
  }
  local_5c = nEncVars;
  if (0 < nPars) {
    memset(vValues->pArray,0,(ulong)(uint)nPars << 2);
  }
  vValues->nSize = nPars;
  iVar2 = Gia_QbfVerify(p,vValues);
  uVar11 = 0;
  uVar8 = 0;
  local_70 = p;
  if (iVar2 != 0) {
    local_54 = p->nVars;
    local_48 = (long)(int)local_74;
    local_50 = (long)(int)local_78;
    local_58 = nIterLimit - 1;
    uVar9 = 0;
    local_40 = (ulong)(uint)nIterLimit;
    do {
      local_68 = uVar9;
      if (vValues->nSize != local_54) {
        __assert_fail("Vec_IntSize(p->vValues) == p->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                      ,0x34f,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
      }
      pCof = Gia_QbfCofactor(local_38,nPars,vValues,p->vParMap);
      s = p->pSatSynG;
      if (s == (bmcg_sat_solver *)0x0) {
        iVar2 = Gia_QbfAddCofactor(p,pCof);
      }
      else {
        iVar2 = Gia_QbfAddCofactorG(p,pCof);
      }
      Gia_ManStop(pCof);
      p = local_70;
      if (iVar2 == 0) {
LAB_007a1788:
        printf("The problem is UNSAT after %d iterations.  ",local_68);
        iVar2 = 1;
        goto LAB_007a180e;
      }
      iVar2 = clock_gettime(3,&local_88);
      if (iVar2 < 0) {
        lVar5 = 1;
      }
      else {
        lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
        lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_88.tv_sec * -1000000;
      }
      if (s == (bmcg_sat_solver *)0x0) {
        iVar2 = sat_solver_solve(p->pSatSyn,(lit *)0x0,(lit *)0x0,local_48,0,0,0);
      }
      else {
        iVar2 = bmcg_sat_solver_solve(s,(int *)0x0,0);
      }
      iVar3 = clock_gettime(3,&local_88);
      if (iVar3 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
      }
      p->clkSat = p->clkSat + lVar6 + lVar5;
      if (fVerbose != 0) {
        Gia_QbfPrint(p,vValues,(int)local_68);
      }
      uVar9 = local_40;
      if (iVar2 == -1) goto LAB_007a1788;
      uVar8 = (uint)local_68;
      iVar3 = (int)local_40;
      if (iVar2 == 0) {
LAB_007a173f:
        if (local_78 == 0) {
LAB_007a17d0:
          uVar12 = (ulong)local_74;
          if (local_74 == 0) {
            if (iVar3 == 0) {
              iVar2 = -1;
              goto LAB_007a172a;
            }
            pcVar7 = "The problem aborted after %d iterations.  ";
            uVar12 = uVar9 & 0xffffffff;
          }
          else {
            pcVar7 = "The problem aborted after %d conflicts.  ";
          }
        }
        else {
          iVar2 = clock_gettime(3,&local_88);
          if (iVar2 < 0) {
            lVar5 = -1;
          }
          else {
            lVar5 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
          }
          if ((lVar5 - p->clkStart) / 1000000 < local_50) goto LAB_007a17d0;
          pcVar7 = "The problem timed out after %d sec.  ";
          uVar12 = (ulong)local_78;
        }
        printf(pcVar7,uVar12);
        iVar2 = -1;
        goto LAB_007a180e;
      }
      Gia_QbfOnePattern(p,vValues);
      if (vValues->nSize != p->nPars) {
        __assert_fail("Vec_IntSize(p->vValues) == p->nPars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                      ,0x361,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
      }
      if (iVar3 != 0 && local_58 == uVar8) goto LAB_007a173f;
      if (local_78 != 0) {
        iVar2 = clock_gettime(3,&local_88);
        if (iVar2 < 0) {
          lVar5 = -1;
        }
        else {
          lVar5 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
        }
        if (local_50 <= (lVar5 - p->clkStart) / 1000000) goto LAB_007a173f;
      }
      iVar2 = Gia_QbfVerify(p,vValues);
      uVar8 = uVar8 + 1;
      uVar9 = (ulong)uVar8;
    } while (iVar2 != 0);
  }
  if (0 < (long)vValues->nSize) {
    lVar5 = 0;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + (vValues->pArray[lVar5] == 0);
      lVar5 = lVar5 + 1;
    } while (vValues->nSize != lVar5);
  }
  printf("Parameters: ");
  if (vValues->nSize != nPars) {
    __assert_fail("Vec_IntSize(p->vValues) == nPars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                  ,0x36c,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
  }
  if (0 < nPars) {
    lVar5 = 0;
    do {
      printf("%d",(ulong)(vValues->pArray[lVar5] != 0));
      lVar5 = lVar5 + 1;
      nPars = vValues->nSize;
      p = local_70;
    } while (lVar5 < nPars);
  }
  printf("  Statistics: 0=%d 1=%d\n",(ulong)uVar11,(ulong)(nPars - uVar11));
  iVar2 = 0;
  if (local_5c != 0) {
    iVar2 = vValues->nSize / (1 << ((byte)local_5c & 0x1f));
    if (vValues->nSize != iVar2 << ((byte)local_5c & 0x1f)) {
      __assert_fail("Vec_IntSize(p->vValues) == (1 << nEncVars) * nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaQbf.c"
                    ,0x372,"int Gia_QbfSolve(Gia_Man_t *, int, int, int, int, int, int, int)");
    }
    Gia_Gen2CodePrint(local_5c,iVar2,vValues);
    iVar2 = 0;
  }
LAB_007a172a:
  printf("The problem is SAT after %d iterations.  ",(ulong)uVar8);
LAB_007a180e:
  if (fVerbose == 0) {
    iVar13 = 3;
    iVar3 = clock_gettime(3,&local_88);
    if (iVar3 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
    }
    lVar5 = lVar5 - p->clkStart;
    pcVar7 = "Time";
  }
  else {
    iVar3 = 10;
    putchar(10);
    lVar6 = p->clkSat;
    Abc_Print(iVar3,"%s =","SAT  ");
    Abc_Print(iVar3,"%9.2f sec\n",(double)lVar6 / 1000000.0);
    iVar13 = 3;
    iVar3 = clock_gettime(3,&local_88);
    lVar5 = -1;
    lVar10 = -1;
    if (-1 < iVar3) {
      lVar10 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
    }
    lVar1 = local_70->clkStart;
    Abc_Print(iVar13,"%s =","Other");
    Abc_Print(iVar13,"%9.2f sec\n",(double)(lVar10 - (lVar6 + lVar1)) / 1000000.0);
    iVar13 = 3;
    iVar3 = clock_gettime(3,&local_88);
    if (-1 < iVar3) {
      lVar5 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
    }
    lVar5 = lVar5 - lVar1;
    pcVar7 = "TOTAL";
    p = local_70;
  }
  Abc_Print(iVar13,"%s =",pcVar7);
  Abc_Print(iVar13,"%9.2f sec\n",(double)lVar5 / 1000000.0);
  Gia_QbfFree(p);
  return iVar2;
}

Assistant:

int Gia_QbfSolve( Gia_Man_t * pGia, int nPars, int nIterLimit, int nConfLimit, int nTimeOut, int nEncVars, int fGlucose, int fVerbose )
{
    Qbf_Man_t * p = Gia_QbfAlloc( pGia, nPars, fGlucose, fVerbose );
    Gia_Man_t * pCof;
    int i, status, RetValue = 0;
    abctime clk;
//    Gia_QbfAddSpecialConstr( p );
    if ( fVerbose )
        printf( "Solving QBF for \"%s\" with %d parameters, %d variables and %d AIG nodes.\n", 
            Gia_ManName(pGia), p->nPars, p->nVars, Gia_ManAndNum(pGia) );
    assert( Gia_ManRegNum(pGia) == 0 );
    Vec_IntFill( p->vValues, nPars, 0 );
    for ( i = 0; Gia_QbfVerify(p, p->vValues); i++ )
    {
        // generate next constraint
        assert( Vec_IntSize(p->vValues) == p->nVars );
        pCof = Gia_QbfCofactor( pGia, nPars, p->vValues, p->vParMap );
        status = p->pSatSynG ? Gia_QbfAddCofactorG( p, pCof ) : Gia_QbfAddCofactor( p, pCof );
        Gia_ManStop( pCof );
        if ( status == 0 )       { RetValue =  1; break; }
        // synthesize next assignment
        clk = Abc_Clock();
        if ( p->pSatSynG )
            status = bmcg_sat_solver_solve( p->pSatSynG, NULL, 0 );
        else
            status = sat_solver_solve( p->pSatSyn, NULL, NULL, (ABC_INT64_T)nConfLimit, 0, 0, 0 );
        p->clkSat += Abc_Clock() - clk;
        if ( fVerbose )
            Gia_QbfPrint( p, p->vValues, i );
        if ( status == l_False ) { RetValue =  1; break; }
        if ( status == l_Undef ) { RetValue = -1; break; }
        // extract SAT assignment
        Gia_QbfOnePattern( p, p->vValues );
        assert( Vec_IntSize(p->vValues) == p->nPars );
        // examine variables
//        Gia_QbfLearnConstraint( p, p->vValues );
//        Vec_IntPrintBinary( p->vValues ); printf( "\n" );
        if ( nIterLimit && i+1 == nIterLimit ) { RetValue = -1; break; }
        if ( nTimeOut && (Abc_Clock() - p->clkStart)/CLOCKS_PER_SEC >= nTimeOut ) { RetValue = -1; break; }
    }
    if ( RetValue == 0 )
    {
        int nZeros = Vec_IntCountZero( p->vValues );
        printf( "Parameters: " );
        assert( Vec_IntSize(p->vValues) == nPars );
        Vec_IntPrintBinary( p->vValues );
        printf( "  Statistics: 0=%d 1=%d\n", nZeros, Vec_IntSize(p->vValues) - nZeros );
        if ( nEncVars )
        {
            int nBits = Vec_IntSize(p->vValues)/(1 << nEncVars);
            assert( Vec_IntSize(p->vValues) == (1 << nEncVars) * nBits );
            Gia_Gen2CodePrint( nEncVars, nBits, p->vValues );
        }
    }
    if ( RetValue == -1 && nTimeOut && (Abc_Clock() - p->clkStart)/CLOCKS_PER_SEC >= nTimeOut )
        printf( "The problem timed out after %d sec.  ", nTimeOut );
    else if ( RetValue == -1 && nConfLimit )
        printf( "The problem aborted after %d conflicts.  ", nConfLimit );
    else if ( RetValue == -1 && nIterLimit )
        printf( "The problem aborted after %d iterations.  ", nIterLimit );
    else if ( RetValue == 1 )
        printf( "The problem is UNSAT after %d iterations.  ", i );
    else 
        printf( "The problem is SAT after %d iterations.  ", i );
    if ( fVerbose )
    {
        printf( "\n" );
        Abc_PrintTime( 1, "SAT  ", p->clkSat );
        Abc_PrintTime( 1, "Other", Abc_Clock() - p->clkStart - p->clkSat );
        Abc_PrintTime( 1, "TOTAL", Abc_Clock() - p->clkStart );
    }
    else
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    Gia_QbfFree( p );
    return RetValue;
}